

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Array *array)

{
  size_t sVar1;
  pointer pIVar2;
  reference this_00;
  Array local_70;
  HeapTypeInfo local_60;
  Array *local_20;
  Array *array_local;
  size_t i_local;
  TypeBuilder *this_local;
  
  local_20 = array;
  array_local = (Array *)i;
  i_local = (size_t)this;
  sVar1 = size(this);
  if (sVar1 <= i) {
    __assert_fail("i < size() && \"index out of bounds\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x99d,"void wasm::TypeBuilder::setHeapType(size_t, Array)");
  }
  pIVar2 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
           operator->(&this->impl);
  this_00 = std::
            vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
            ::operator[](&pIVar2->entries,(size_type)array_local);
  Array::Array(&local_70,array);
  anon_unknown_0::HeapTypeInfo::HeapTypeInfo(&local_60,&local_70);
  Impl::Entry::set(this_00,&local_60);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_60);
  return;
}

Assistant:

void TypeBuilder::setHeapType(size_t i, Array array) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(array);
}